

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O2

void __thiscall QHttpNetworkConnectionChannel::_q_connected(QHttpNetworkConnectionChannel *this)

{
  QAbstractSocket *absSocket;
  QLocalSocket *localSocket;
  
  absSocket = QtPrivate::qobject_cast_helper<QAbstractSocket*,QObject>(*(QObject **)(this + 0x10));
  if (absSocket != (QAbstractSocket *)0x0) {
    _q_connected_abstract_socket(this,absSocket);
    return;
  }
  localSocket = QtPrivate::qobject_cast_helper<QLocalSocket*,QObject>(*(QObject **)(this + 0x10));
  if (localSocket != (QLocalSocket *)0x0) {
    _q_connected_local_socket(this,localSocket);
    return;
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::_q_connected()
{
    if (auto *s = qobject_cast<QAbstractSocket *>(socket))
        _q_connected_abstract_socket(s);
#if QT_CONFIG(localserver)
    else if (auto *s = qobject_cast<QLocalSocket *>(socket))
        _q_connected_local_socket(s);
#endif
}